

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O2

void Cbs0_ManStop(Cbs0_Man_t *p)

{
  Gia_Obj_t **__ptr;
  
  Vec_IntFree(p->vModel);
  __ptr = (p->pProp).pData;
  if (__ptr != (Gia_Obj_t **)0x0) {
    free(__ptr);
    (p->pProp).pData = (Gia_Obj_t **)0x0;
  }
  free((p->pJust).pData);
  free(p);
  return;
}

Assistant:

void Cbs0_ManStop( Cbs0_Man_t * p )
{
    Vec_IntFree( p->vModel );
    ABC_FREE( p->pProp.pData );
    ABC_FREE( p->pJust.pData );
    ABC_FREE( p );
}